

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::CopyPtrArray<aiMesh>(aiMesh ***dest,aiMesh **src,ai_uint num)

{
  aiMesh **ppaVar1;
  ulong uVar2;
  
  if (num == 0) {
    *dest = (aiMesh **)0x0;
  }
  else {
    ppaVar1 = (aiMesh **)operator_new__((ulong)num << 3);
    *dest = ppaVar1;
    for (uVar2 = 0; (ulong)num << 3 != uVar2; uVar2 = uVar2 + 8) {
      SceneCombiner::Copy((aiMesh **)((long)*dest + uVar2),*(aiMesh **)((long)src + uVar2));
    }
  }
  return;
}

Assistant:

inline
void CopyPtrArray (Type**& dest, const Type* const * src, ai_uint num) {
    if (!num) {
        dest = NULL;
        return;
    }
    dest = new Type*[num];
    for (ai_uint i = 0; i < num;++i) {
        SceneCombiner::Copy(&dest[i],src[i]);
    }
}